

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O1

TabularDataFile * __thiscall asl::TabularDataFile::operator<<(TabularDataFile *this,Var *x)

{
  anon_union_8_8_7df20137_for_Var_3 *paVar1;
  Array<asl::Var> *this_00;
  Var *pVVar2;
  bool bVar3;
  int iVar4;
  char *__ptr;
  undefined8 b;
  anon_union_16_2_78e7fdac_for_String_2 *paVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  String row;
  String value;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  String *local_38;
  
  __ptr = "\n";
  bVar3 = Var::operator==(x,"\n");
  if ((!bVar3) || (bVar3 = true, (int)(this->_row)._a[-1]._type < 1)) {
    if (x->_type == ARRAY) {
      local_98._0_8_ = (x->field_1)._l;
      LOCK();
      (((Var *)(local_98._0_8_ + -0x10))->field_1)._i =
           (((Var *)(local_98._0_8_ + -0x10))->field_1)._i + 1;
      UNLOCK();
      pVVar2 = (this->_row)._a;
      if (pVVar2 != (Var *)local_98._0_8_) {
        LOCK();
        paVar1 = &pVVar2[-1].field_1;
        paVar1->_i = paVar1->_i + -1;
        UNLOCK();
        if (paVar1->_i == 0) {
          Array<asl::Var>::free(&this->_row,__ptr);
        }
        (this->_row)._a = (Var *)local_98._0_8_;
        LOCK();
        (((Var *)(local_98._0_8_ + -0x10))->field_1)._i =
             (((Var *)(local_98._0_8_ + -0x10))->field_1)._i + 1;
        UNLOCK();
      }
      Array<asl::Var>::~Array((Array<asl::Var> *)&local_98);
    }
    else {
      Array<asl::Var>::insert(&this->_row,-1,x);
    }
    bVar3 = false;
  }
  if ((bVar3) || ((this->_row)._a[-1]._type == *(Type *)&(this->_columnNames)._a[-1].field_2)) {
    local_98.field_2._space[0] = '\0';
    local_98._0_8_ = (Var *)0x0;
    if (this->_dataStarted == false) {
      String::operator+=(&local_98,'\n');
      this->_dataStarted = true;
    }
    this_00 = &this->_row;
    if (0 < (int)this_00->_a[-1]._type) {
      local_38 = &this->_equote;
      lVar7 = 0;
      lVar6 = 0;
      do {
        if (lVar6 != 0) {
          String::operator+=(&local_98,this->_separator);
        }
        pVVar2 = (Var *)((long)&this_00->_a->_type + lVar7);
        if (*(int *)((long)&this_00->_a->_type + lVar7) == 0) {
          local_80.field_2._space[0] = '\0';
          local_80._size = 0;
          local_80._len = 0;
        }
        else {
          Var::toString(&local_80,pVVar2);
        }
        if ((pVVar2->_type < (FLOAT|NUL)) && ((0x54U >> (pVVar2->_type & 0x1f) & 1) != 0)) {
          fVar8 = Var::operator_cast_to_float(pVVar2);
          if (!NAN(fVar8)) goto LAB_0013caeb;
        }
        else {
LAB_0013caeb:
          if (((this->_decimal == '.') || (FLOAT < pVVar2->_type)) ||
             ((0x54U >> (pVVar2->_type & 0x1f) & 1) == 0)) {
            if ((pVVar2->_type == SSTRING) || (pVVar2->_type == STRING)) {
              iVar4 = String::indexOf(&local_80,this->_quote,0);
              if (iVar4 < 0) {
                iVar4 = String::indexOf(&local_80,this->_separator,0);
                if (iVar4 < 0) goto LAB_0013cbfe;
              }
              String::operator+=(&local_98,this->_quote);
              local_50.field_2._space[0] = this->_quote;
              local_50._size = 0;
              local_50._len = 1;
              local_50.field_2._space[1] = '\0';
              String::replace(&local_68,&local_80,&local_50,local_38);
              b = &local_68.field_2;
              if (local_68._size != 0) {
                b = local_68.field_2._str;
              }
              String::append(&local_98,(char *)b,local_68._len);
              String::operator+=(&local_98,this->_quote);
              if (local_68._size != 0) {
                free(local_68.field_2._str);
              }
              if (local_50._size != 0) {
                free((void *)CONCAT62(local_50.field_2._2_6_,
                                      CONCAT11(local_50.field_2._space[1],local_50.field_2._space[0]
                                              )));
              }
              goto LAB_0013cc1b;
            }
          }
          else {
            String::replaceme(&local_80,'.',this->_decimal);
          }
LAB_0013cbfe:
          paVar5 = &local_80.field_2;
          if (local_80._size != 0) {
            paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)
                     CONCAT71(local_80.field_2._1_7_,local_80.field_2._space[0]);
          }
          String::append(&local_98,paVar5->_space,local_80._len);
        }
LAB_0013cc1b:
        if (local_80._size != 0) {
          free((void *)CONCAT71(local_80.field_2._1_7_,local_80.field_2._space[0]));
        }
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar6 < (int)this_00->_a[-1]._type);
    }
    String::operator+=(&local_98,'\n');
    if (local_98._size == 0) {
      paVar5 = &local_98.field_2;
    }
    else {
      paVar5 = (anon_union_16_2_78e7fdac_for_String_2 *)
               CONCAT71(local_98.field_2._1_7_,local_98.field_2._space[0]);
    }
    TextFile::operator<<(&this->_file,paVar5->_space);
    iVar4 = this->_rowIndex + 1;
    this->_rowIndex = iVar4;
    if (iVar4 == this->_flushEvery) {
      fflush((FILE *)(this->_file).super_File._file);
      this->_rowIndex = 0;
    }
    Array<asl::Var>::resize(this_00,0);
    if (local_98._size != 0) {
      free((void *)CONCAT71(local_98.field_2._1_7_,local_98.field_2._space[0]));
    }
  }
  return this;
}

Assistant:

TabularDataFile& TabularDataFile::operator<<(const Var& x)
{
	bool rowFull = false;
	if (x == "\n" && _row.length() > 0)
		rowFull = true;
	else if (x.is(Var::ARRAY))
		_row = x.array();
	else
		_row << x;
	if (_row.length() == _columnNames.length() || rowFull)
	{
		String row;
		if(!_dataStarted)
		{
			row << '\n';
			_dataStarted = true;
		}
		for(int i=0; i<_row.length(); i++)
		{
			if(i>0)
				row << _separator;
			Var& item = _row[i];
			String value = item.ok() ? item.toString() : String();

			if (item.is(Var::NUMBER))
			{
				float y = item; // print nans empty
				if (y != y)
					continue;
			}
			if (_decimal != '.' && item.is(Var::NUMBER))
			{
				value.replaceme('.', _decimal);
				row << value;
			}
			else if (item.is(Var::STRING))
			{
				if (value.contains(_quote) || value.contains(_separator))
					row << _quote << value.replace(_quote, _equote) << _quote;
				else
					row << value;
			}
			else
				row << value;
		}
		row << '\n';
		_file << *row;
		if(++_rowIndex == _flushEvery)
		{
			_file.flush();
			_rowIndex = 0;
		}
		_row.clear();
	}
	return *this;
}